

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

bool __thiscall libchars::command_cursor::next(command_cursor *this)

{
  iterator *piVar1;
  ulong uVar2;
  ulong uVar3;
  command_node **ppcVar4;
  size_type sVar5;
  _Elt_pointer ppcVar6;
  _Elt_pointer ppcVar7;
  _Elt_pointer ppcVar8;
  bool bVar9;
  command_node *pcVar10;
  size_t sVar11;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined1 local_50 [8];
  string rstr;
  command_node *n;
  
  ppcVar6 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar6 ==
      (this->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    ppcVar4 = &this->root;
  }
  else {
    if (ppcVar6 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar6 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppcVar4 = ppcVar6 + -1;
  }
  pcVar10 = *ppcVar4;
  if (pcVar10 == (command_node *)0x0) {
    return false;
  }
  rstr.field_2._8_8_ = pcVar10;
  remainder_abi_cxx11_((command_cursor *)local_50,in_XMM0_Qa,in_XMM1_Qa);
  if (rstr._M_dataplus._M_p == (pointer)0x0) {
    ppcVar6 = (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pcVar10->head == (command_node *)0x0) {
      ppcVar8 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppcVar7 = ppcVar6;
      if ((ppcVar6 != ppcVar8) && (ppcVar7 = ppcVar8, pcVar10->next == (command_node *)0x0)) {
        while( true ) {
          uVar2 = this->idx;
          if ((uVar2 != 0) &&
             (uVar3 = (this->w)._M_string_length, sVar5 = uVar3 - uVar2, uVar2 <= uVar3)) {
            (this->w)._M_string_length = sVar5;
            (this->w)._M_dataplus._M_p[sVar5] = '\0';
          }
          std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                    ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
                     this);
          ppcVar7 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
          ppcVar6 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppcVar6 == ppcVar7) break;
          ppcVar8 = ppcVar6;
          if (ppcVar6 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppcVar8 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          pcVar10 = ppcVar8[-1];
          rstr.field_2._8_8_ = pcVar10;
          if (pcVar10 == (command_node *)0x0) {
            pcVar10 = (command_node *)0x0;
            sVar11 = 0;
            goto LAB_0010b40d;
          }
          this->idx = (pcVar10->part)._M_string_length;
          if ((ppcVar6 == ppcVar7) || (pcVar10->next != (command_node *)0x0)) goto LAB_0010b414;
        }
        if (this->root == (command_node *)0x0) {
          sVar11 = 0;
        }
        else {
          uVar2 = (this->root->part)._M_string_length;
          sVar11 = 0;
          if (this->root_idx <= uVar2) {
            sVar11 = uVar2 - this->root_idx;
          }
        }
LAB_0010b40d:
        this->idx = sVar11;
      }
LAB_0010b414:
      uVar2 = this->idx;
      if ((uVar2 != 0) &&
         (uVar3 = (this->w)._M_string_length, sVar5 = uVar3 - uVar2, uVar2 <= uVar3)) {
        (this->w)._M_string_length = sVar5;
        (this->w)._M_dataplus._M_p[sVar5] = '\0';
        ppcVar7 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        ppcVar6 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      this->idx = 0;
      if ((ppcVar6 == ppcVar7) || (pcVar10 == (command_node *)0x0)) {
        (this->w)._M_string_length = 0;
        *(this->w)._M_dataplus._M_p = '\0';
      }
      else {
        pcVar10 = pcVar10->next;
        rstr.field_2._8_8_ = pcVar10;
        std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                  ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
                   this);
        if (pcVar10 != (command_node *)0x0) {
          ppcVar6 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppcVar6 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            bVar9 = true;
            std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>::
            _M_push_back_aux<libchars::command_node*const&>
                      ((deque<libchars::command_node*,std::allocator<libchars::command_node*>> *)
                       this,(command_node **)((long)&rstr.field_2 + 8));
            goto LAB_0010b3bd;
          }
          *ppcVar6 = pcVar10;
          piVar1 = &(this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
          goto LAB_0010b3ba;
        }
      }
      bVar9 = false;
      goto LAB_0010b3bd;
    }
    if (ppcVar6 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>::
      _M_push_back_aux<libchars::command_node*const&>
                ((deque<libchars::command_node*,std::allocator<libchars::command_node*>> *)this,
                 &pcVar10->head);
    }
    else {
      *ppcVar6 = pcVar10->head;
      piVar1 = &(this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    this->idx = 0;
  }
  else {
    std::__cxx11::string::_M_append((char *)&this->w,(ulong)local_50);
    this->idx = (size_t)(rstr._M_dataplus._M_p + this->idx);
  }
LAB_0010b3ba:
  bVar9 = true;
LAB_0010b3bd:
  if (local_50 != (undefined1  [8])&rstr._M_string_length) {
    operator_delete((void *)local_50,rstr._M_string_length + 1);
  }
  return bVar9;
}

Assistant:

bool command_cursor::next()
    {
        // depth first search
        command_node *n = current();
        if (n == NULL)
            return false;

        /*
        if (S.empty())
            LC_LOG_VERBOSE("root[%p]@%zu; w[%s]",root,idx,w.c_str());
        else
            LC_LOG_VERBOSE("n[%p]@%zu; w[%s]",n,idx,w.c_str());
        */

        std::string rstr = remainder();
        if (!rstr.empty()) {
            //LC_LOG_VERBOSE("w + [%s]",rstr.c_str());
            w.append(rstr);
            idx += rstr.length();
            return true;
        }
        else if (n->head != NULL) {
            //LC_LOG_VERBOSE("push[%p;next=%p]",n->head,n->head->next);
            S.push(n->head);
            idx = 0;
            return true;
        }
        else {
            while (!S.empty() && n != NULL && n->next == NULL) {
                if (idx > 0 && idx <= w.length())
                    w.erase(w.length() - idx);

                //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
                S.pop();

                if (S.empty()) {
                    if (root != NULL && root_idx < root->part.length())
                        idx = root->part.length() - root_idx;
                    else
                        idx = 0;
                }
                else {
                    if ((n = S.top()) != NULL)
                        idx = n->part.length();
                    else
                        idx = 0;
                }
            }

            if (idx > 0 && idx <= w.length())
                w.erase(w.length() - idx);

            idx = 0;
            if (S.empty() || n == NULL) {
                w.clear();
                return false;
            }

            n = n->next;
            //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
            S.pop();

            if (n != NULL) {
                //LC_LOG_VERBOSE("push[%p;next=%p]",n,n->next);
                S.push(n);
                return true;
            }
        }
        return false;
    }